

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O1

mp_int * probprime_generate(PrimeGenerationContext *ctx,PrimeCandidateSource *pcs,
                           ProgressReceiver *prog)

{
  bool bVar1;
  _Bool _Var2;
  uint uVar3;
  mp_int *p;
  MillerRabin *mr;
  size_t sVar4;
  mp_int *unaff_R15;
  
  pcs_ready(pcs);
  do {
    (*prog->vt->report_attempt)(prog);
    p = pcs_generate(pcs);
    if (p == (mp_int *)0x0) {
      pcs_free(pcs);
      bVar1 = false;
      unaff_R15 = (mp_int *)0x0;
    }
    else {
      mr = miller_rabin_new(p);
      sVar4 = mp_get_nbits(p);
      for (uVar3 = miller_rabin_checks_needed((uint)sVar4); uVar3 != 0; uVar3 = uVar3 - 1) {
        _Var2 = miller_rabin_test_random(mr);
        if (!_Var2) {
          miller_rabin_free(mr);
          mp_free(p);
          bVar1 = true;
          goto LAB_00116c43;
        }
      }
      miller_rabin_free(mr);
      pcs_free(pcs);
      bVar1 = false;
      unaff_R15 = p;
    }
LAB_00116c43:
    if (!bVar1) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

static mp_int *probprime_generate(
    PrimeGenerationContext *ctx,
    PrimeCandidateSource *pcs, ProgressReceiver *prog)
{
    pcs_ready(pcs);

    while (true) {
        progress_report_attempt(prog);

        mp_int *p = pcs_generate(pcs);
        if (!p) {
            pcs_free(pcs);
            return NULL;
        }

        MillerRabin *mr = miller_rabin_new(p);
        bool known_bad = false;
        unsigned nchecks = miller_rabin_checks_needed(mp_get_nbits(p));
        for (unsigned check = 0; check < nchecks; check++) {
            if (!miller_rabin_test_random(mr)) {
                known_bad = true;
                break;
            }
        }
        miller_rabin_free(mr);

        if (!known_bad) {
            /*
             * We have a prime!
             */
            pcs_free(pcs);
            return p;
        }

        mp_free(p);
    }
}